

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS ref_egads_diagonal(REF_GEOM ref_geom,REF_INT geom,REF_DBL *diag)

{
  REF_DBL *diag_local;
  REF_INT geom_local;
  REF_GEOM ref_geom_local;
  
  printf("returning 1.0 from %s, No EGADS\n","ref_egads_diagonal");
  *diag = 1.0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_diagonal(REF_GEOM ref_geom, REF_INT geom,
                                      REF_DBL *diag) {
#ifdef HAVE_EGADS
  ego object;
  double box[6];

  object = (ego)(ref_geom->body);
  RNS(object, "EGADS body object is NULL. Has the geometry been loaded?");

  if (geom < 0) {
    object = (ego)(ref_geom->body);
  } else {
    switch (ref_geom_type(ref_geom, geom)) {
      case REF_GEOM_EDGE:
        object = ((ego *)(ref_geom->edges))[ref_geom_id(ref_geom, geom) - 1];
        break;
      case REF_GEOM_FACE:
        object = ((ego *)(ref_geom->faces))[ref_geom_id(ref_geom, geom) - 1];
        break;
      default:
        *diag = 0.0; /* for node */
        return REF_SUCCESS;
    }
  }

  REIS(EGADS_SUCCESS, EG_getBoundingBox(object, box), "EG bounding box");
  *diag = sqrt((box[0] - box[3]) * (box[0] - box[3]) +
               (box[1] - box[4]) * (box[1] - box[4]) +
               (box[2] - box[5]) * (box[2] - box[5]));

#else
  printf("returning 1.0 from %s, No EGADS\n", __func__);
  *diag = 1.0;
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(geom);
#endif

  return REF_SUCCESS;
}